

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

void __thiscall
soplex::LPColSetBase<double>::add
          (LPColSetBase<double> *this,DataKey *newkey,double *obj,double *newlower,
          SVectorBase<double> *newcolVector,double *newupper,int *newscaleExp)

{
  pointer pdVar1;
  long lVar2;
  int newdim;
  
  SVSetBase<double>::add(&this->super_SVSetBase<double>,newkey,newcolVector);
  newdim = (this->super_SVSetBase<double>).set.thenum;
  pdVar1 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->low).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3) < newdim)
  {
    VectorBase<double>::reDim(&this->low,newdim,true);
    VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
    VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
    DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
    newdim = (this->super_SVSetBase<double>).set.thenum;
    pdVar1 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lVar2 = (long)newdim;
  pdVar1[lVar2 + -1] = *newlower;
  (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start[lVar2 + -1] = *newupper;
  (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar2 + -1] = *obj;
  (this->scaleExp).data[lVar2 + -1] = *newscaleExp;
  return;
}

Assistant:

void add(DataKey& newkey, const R& obj, const R& newlower, const SVectorBase<R>& newcolVector,
            const R& newupper, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newcolVector);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      low[num() - 1] = newlower;
      up[num() - 1] = newupper;
      object[num() - 1] = obj;
      scaleExp[num() - 1] = newscaleExp;
   }